

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

void TTA::MemUpdateTable(uint u,uint v)

{
  uint uVar1;
  uint *puVar2;
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  uint v_local;
  uint u_local;
  
  local_14 = v;
  if (u < v) {
    while (local_14 != 0xffffffff) {
      puVar2 = MemVector<unsigned_int>::operator[](&mem_rtable_,local_14);
      *puVar2 = u;
      puVar2 = MemVector<unsigned_int>::operator[](&mem_next_,local_14);
      local_14 = *puVar2;
    }
    puVar2 = MemVector<unsigned_int>::operator[](&mem_tail_,u);
    puVar2 = MemVector<unsigned_int>::operator[](&mem_next_,*puVar2);
    *puVar2 = v;
    puVar2 = MemVector<unsigned_int>::operator[](&mem_tail_,v);
    uVar1 = *puVar2;
    puVar2 = MemVector<unsigned_int>::operator[](&mem_tail_,u);
    *puVar2 = uVar1;
  }
  else {
    local_18 = u;
    if (v < u) {
      while (local_18 != 0xffffffff) {
        puVar2 = MemVector<unsigned_int>::operator[](&mem_rtable_,local_18);
        *puVar2 = v;
        puVar2 = MemVector<unsigned_int>::operator[](&mem_next_,local_18);
        local_18 = *puVar2;
      }
      puVar2 = MemVector<unsigned_int>::operator[](&mem_tail_,v);
      puVar2 = MemVector<unsigned_int>::operator[](&mem_next_,*puVar2);
      *puVar2 = u;
      puVar2 = MemVector<unsigned_int>::operator[](&mem_tail_,u);
      uVar1 = *puVar2;
      puVar2 = MemVector<unsigned_int>::operator[](&mem_tail_,v);
      *puVar2 = uVar1;
    }
  }
  return;
}

Assistant:

static void MemUpdateTable(unsigned u, unsigned v)
    {
        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                mem_rtable_[i] = u;
                i = mem_next_[i];
            }
            mem_next_[mem_tail_[u]] = v;
            mem_tail_[u] = mem_tail_[v];
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                mem_rtable_[i] = v;
                i = mem_next_[i];
            }
            mem_next_[mem_tail_[v]] = u;
            mem_tail_[v] = mem_tail_[u];
        }
    }